

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp_bicubic.h
# Opt level: O0

void ncnn::resize_bicubic_image(Mat *src,Mat *dst,float *alpha,int *xofs,float *beta,int *yofs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  float *pfVar21;
  float *pfVar22;
  float *pfVar23;
  long in_RCX;
  float *in_RDX;
  long *in_RSI;
  long *in_RDI;
  float *in_R8;
  long in_R9;
  float fVar24;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  __m128 _Dp_1;
  __m128 _rows3_1;
  __m128 _rows2_1;
  __m128 _rows1_1;
  __m128 _rows0_1;
  __m128 _b3_128;
  __m128 _b2_128;
  __m128 _b1_128;
  __m128 _b0_128;
  __m256 _Dp;
  __m256 _rows3;
  __m256 _rows2;
  __m256 _rows1;
  __m256 _rows0;
  __m256 _b3_256;
  __m256 _b2_256;
  __m256 _b1_256;
  __m256 _b0_256;
  int dx;
  float *Dp;
  float *rows3p;
  float *rows2p;
  float *rows1p;
  float *rows0p;
  float b3;
  float b2;
  float b1;
  float b0;
  float a3_3;
  float a2_3;
  float a1_3;
  float a0_3;
  float *S3p_3;
  float *S2p_2;
  float *S1p_1;
  float *S0p;
  int sx_3;
  int dx_4;
  float *rows3p_4;
  float *rows2p_3;
  float *rows1p_2;
  float *rows0p_1;
  float *alphap_3;
  float *S3_3;
  float *S2_2;
  float *S1_1;
  float *S0;
  float a3_2;
  float a2_2;
  float a1_2;
  float a0_2;
  float *S3p_2;
  float *S2p_1;
  float *S1p;
  int sx_2;
  int dx_3;
  float *rows3p_3;
  float *rows2p_2;
  float *rows1p_1;
  float *alphap_2;
  float *S3_2;
  float *S2_1;
  float *S1;
  float *rows2_old;
  float *rows1_old_1;
  float *rows0_old_2;
  float a3_1;
  float a2_1;
  float a1_1;
  float a0_1;
  float *S3p_1;
  float *S2p;
  int sx_1;
  int dx_2;
  float *rows3p_2;
  float *rows2p_1;
  float *alphap_1;
  float *S3_1;
  float *S2;
  float *rows1_old;
  float *rows0_old_1;
  float a3;
  float a2;
  float a1;
  float a0;
  float *S3p;
  int sx;
  int dx_1;
  float *rows3p_1;
  float *alphap;
  float *S3;
  float *rows0_old;
  int sy;
  int dy;
  int prev_sy1;
  float *rows3;
  float *rows2;
  float *rows1;
  float *rows0;
  Mat rowsbuf3;
  Mat rowsbuf2;
  Mat rowsbuf1;
  Mat rowsbuf0;
  int h;
  int w;
  Allocator *in_stack_fffffffffffff0b0;
  size_t in_stack_fffffffffffff0b8;
  int in_stack_fffffffffffff0c4;
  Mat *in_stack_fffffffffffff0c8;
  undefined8 local_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 local_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 local_d10;
  undefined8 uStack_d08;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 local_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 local_cd0;
  undefined8 uStack_cc8;
  undefined8 local_cc0;
  undefined8 uStack_cb8;
  undefined8 uStack_cb0;
  undefined8 uStack_ca8;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  undefined8 local_c00;
  undefined8 uStack_bf8;
  undefined8 uStack_bf0;
  undefined8 uStack_be8;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  int local_b94;
  float *local_b90;
  float *local_b88;
  float *local_b80;
  float *local_b78;
  float *local_b70;
  float local_b68;
  float local_b64;
  float local_b60;
  float local_b5c;
  float local_b58;
  float local_b54;
  float local_b50;
  float local_b4c;
  float *local_b48;
  float *local_b40;
  float *local_b38;
  float *local_b30;
  int local_b28;
  int local_b24;
  float *local_b20;
  float *local_b18;
  float *local_b10;
  float *local_b08;
  float *local_b00;
  long local_af8;
  long local_af0;
  long local_ae8;
  long local_ae0;
  float local_ad8;
  float local_ad4;
  float local_ad0;
  float local_acc;
  float *local_ac8;
  float *local_ac0;
  float *local_ab8;
  int local_ab0;
  int local_aac;
  float *local_aa8;
  float *local_aa0;
  float *local_a98;
  float *local_a90;
  long local_a88;
  long local_a80;
  long local_a78;
  float *local_a70;
  float *local_a68;
  float *local_a60;
  float local_a58;
  float local_a54;
  float local_a50;
  float local_a4c;
  float *local_a48;
  float *local_a40;
  int local_a38;
  int local_a34;
  float *local_a30;
  float *local_a28;
  float *local_a20;
  long local_a18;
  long local_a10;
  float *local_a08;
  float *local_a00;
  float local_9f8;
  float local_9f4;
  float local_9f0;
  float local_9ec;
  float *local_9e8;
  int local_9e0;
  int local_9dc;
  float *local_9d8;
  float *local_9d0;
  long local_9c8;
  float *local_9c0;
  int local_9b4;
  int local_9b0;
  int local_9ac;
  float *local_9a8;
  float *local_9a0;
  float *local_998;
  float *local_990;
  float *local_988;
  int *local_980;
  undefined8 local_978;
  undefined4 local_970;
  long *local_968;
  undefined4 local_960;
  undefined4 local_95c;
  undefined4 local_958;
  undefined4 local_954;
  undefined4 local_950;
  undefined8 local_948;
  float *local_940;
  int *local_938;
  undefined8 local_930;
  undefined4 local_928;
  long *local_920;
  undefined4 local_918;
  undefined4 local_914;
  undefined4 local_910;
  undefined4 local_90c;
  undefined4 local_908;
  undefined8 local_900;
  float *local_8e8;
  int *local_8e0;
  undefined8 local_8d8;
  undefined4 local_8d0;
  long *local_8c8;
  undefined4 local_8c0;
  undefined4 local_8bc;
  undefined4 local_8b8;
  undefined4 local_8b4;
  undefined4 local_8b0;
  undefined8 local_8a8;
  float *local_8a0;
  int *local_898;
  undefined8 local_890;
  undefined4 local_888;
  long *local_880;
  undefined4 local_878;
  undefined4 local_874;
  undefined4 local_870;
  undefined4 local_86c;
  undefined4 local_868;
  undefined8 local_860;
  int local_858;
  int local_854;
  long local_850;
  float *local_848;
  long local_840;
  float *local_838;
  long *local_830;
  long *local_828;
  float **local_820;
  float **local_810;
  float **local_800;
  float **local_7f0;
  int local_7dc;
  long *local_7d8;
  int local_7cc;
  long *local_7c8;
  int local_7bc;
  long *local_7b8;
  int local_7ac;
  long *local_7a8;
  int local_79c;
  long *local_798;
  int local_78c;
  long *local_788;
  int local_77c;
  long *local_778;
  int local_76c;
  long *local_768;
  int local_75c;
  long *local_758;
  int local_74c;
  long *local_748;
  int local_73c;
  long *local_738;
  float local_730;
  float local_72c;
  float local_728;
  float local_724;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 *local_6d8;
  undefined8 *local_6d0;
  undefined8 *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  float local_6a0;
  float fStack_69c;
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  float fStack_684;
  undefined8 *local_678;
  undefined8 *local_670;
  undefined8 *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 *local_618;
  undefined8 *local_610;
  undefined8 *local_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_5a4;
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float local_584;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  float local_564;
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float local_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined8 *local_518;
  undefined8 *local_510;
  undefined8 *local_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 local_4f0;
  undefined8 uStack_4e8;
  undefined8 *local_4d8;
  undefined8 *local_4d0;
  undefined8 *local_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 local_4b0;
  undefined8 uStack_4a8;
  undefined8 *local_498;
  undefined8 *local_490;
  undefined8 *local_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 local_470;
  undefined8 uStack_468;
  int local_450;
  undefined4 local_44c;
  float **local_448;
  int local_430;
  undefined4 local_42c;
  float **local_428;
  int local_410;
  undefined4 local_40c;
  float **local_408;
  int local_3f0;
  undefined4 local_3ec;
  float **local_3e8;
  float *local_3e0;
  float *local_3d0;
  float *local_3c0;
  float *local_3b0;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  float *local_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float *local_348;
  undefined1 local_340 [32];
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  float local_310;
  float local_30c;
  float local_308;
  float local_304;
  undefined1 local_300 [32];
  float local_2e0;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float local_29c;
  float local_298;
  float local_294;
  float local_290;
  float local_28c;
  float local_288;
  float local_284;
  undefined1 local_280 [32];
  float local_260;
  float local_25c;
  float local_258;
  float local_254;
  float local_250;
  float local_24c;
  float local_248;
  float local_244;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220;
  float fStack_21c;
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  float local_1a0;
  float fStack_19c;
  float fStack_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_170;
  undefined8 uStack_168;
  float local_160;
  float fStack_15c;
  float fStack_158;
  float fStack_154;
  undefined8 local_150;
  undefined8 uStack_148;
  float local_140;
  float fStack_13c;
  float fStack_138;
  float fStack_134;
  undefined8 local_130;
  undefined8 uStack_128;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float **local_110;
  float **local_108;
  float **local_100;
  float **local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  int local_dc;
  float **local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  int local_bc;
  float **local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  int local_9c;
  float **local_98;
  undefined8 local_90;
  undefined8 local_88;
  int local_7c;
  float **local_78;
  float *local_70;
  float *local_68;
  float *local_60;
  float *local_58;
  float *local_50;
  float *local_48;
  float *local_40;
  float *local_38;
  
  local_854 = *(int *)((long)in_RSI + 0x2c);
  local_858 = (int)in_RSI[6];
  local_d8 = &local_8a0;
  local_e8 = 4;
  local_f0 = 0;
  local_8a0 = (float *)0x0;
  local_898 = (int *)0x0;
  local_890 = 0;
  local_888 = 0;
  local_880 = (long *)0x0;
  local_878 = 0;
  local_874 = 0;
  local_870 = 0;
  local_86c = 0;
  local_868 = 0;
  local_860 = 0;
  local_850 = in_R9;
  local_848 = in_R8;
  local_840 = in_RCX;
  local_838 = in_RDX;
  local_830 = in_RSI;
  local_828 = in_RDI;
  local_dc = local_854;
  Mat::create(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c4,in_stack_fffffffffffff0b8,
              in_stack_fffffffffffff0b0);
  local_b8 = &local_8e8;
  local_bc = local_854;
  local_c8 = 4;
  local_d0 = 0;
  local_8e8 = (float *)0x0;
  local_8e0 = (int *)0x0;
  local_8d8 = 0;
  local_8d0 = 0;
  local_8c8 = (long *)0x0;
  local_8c0 = 0;
  local_8bc = 0;
  local_8b8 = 0;
  local_8b4 = 0;
  local_8b0 = 0;
  local_8a8 = 0;
  Mat::create(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c4,in_stack_fffffffffffff0b8,
              in_stack_fffffffffffff0b0);
  local_98 = &local_940;
  local_9c = local_854;
  local_a8 = 4;
  local_b0 = 0;
  local_940 = (float *)0x0;
  local_938 = (int *)0x0;
  local_930 = 0;
  local_928 = 0;
  local_920 = (long *)0x0;
  local_918 = 0;
  local_914 = 0;
  local_910 = 0;
  local_90c = 0;
  local_908 = 0;
  local_900 = 0;
  Mat::create(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c4,in_stack_fffffffffffff0b8,
              in_stack_fffffffffffff0b0);
  local_78 = &local_988;
  local_7c = local_854;
  local_88 = 4;
  local_90 = 0;
  local_988 = (float *)0x0;
  local_980 = (int *)0x0;
  local_978 = 0;
  local_970 = 0;
  local_968 = (long *)0x0;
  local_960 = 0;
  local_95c = 0;
  local_958 = 0;
  local_954 = 0;
  local_950 = 0;
  local_948 = 0;
  Mat::create(in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c4,in_stack_fffffffffffff0b8,
              in_stack_fffffffffffff0b0);
  local_f8 = &local_8a0;
  local_990 = local_8a0;
  local_100 = &local_8e8;
  local_998 = local_8e8;
  local_108 = &local_940;
  local_9a0 = local_940;
  local_110 = &local_988;
  local_9a8 = local_988;
  local_9ac = -3;
  for (local_9b0 = 0; pfVar23 = local_990, pfVar22 = local_998, pfVar21 = local_9a0,
      local_9b0 < local_858; local_9b0 = local_9b0 + 1) {
    local_9b4 = *(int *)(local_850 + (long)local_9b0 * 4);
    if (local_9b4 != local_9ac) {
      if (local_9b4 == local_9ac + 1) {
        local_9c0 = local_990;
        local_990 = local_998;
        local_998 = local_9a0;
        local_9a0 = local_9a8;
        local_9a8 = pfVar23;
        local_74c = local_9b4 + 2;
        local_748 = local_828;
        local_9c8 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_74c * local_828[2];
        local_9d0 = local_838;
        local_9d8 = pfVar23;
        for (local_9dc = 0; local_9dc < local_854; local_9dc = local_9dc + 1) {
          local_9e0 = *(int *)(local_840 + (long)local_9dc * 4);
          local_9e8 = (float *)(local_9c8 + (long)local_9e0 * 4);
          local_9ec = *local_9d0;
          local_9f0 = local_9d0[1];
          local_9f4 = local_9d0[2];
          local_9f8 = local_9d0[3];
          pfVar23[local_9dc] =
               local_9e8[-1] * local_9ec + *local_9e8 * local_9f0 + local_9e8[1] * local_9f4 +
               local_9e8[2] * local_9f8;
          local_9d0 = local_9d0 + 4;
        }
      }
      else if (local_9b4 == local_9ac + 2) {
        local_a00 = local_990;
        local_a08 = local_998;
        local_990 = local_9a0;
        local_998 = local_9a8;
        local_9a0 = pfVar23;
        local_9a8 = pfVar22;
        local_75c = local_9b4 + 1;
        local_758 = local_828;
        local_a10 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_75c * local_828[2];
        local_76c = local_9b4 + 2;
        local_768 = local_828;
        local_a18 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_76c * local_828[2];
        local_a20 = local_838;
        local_a28 = pfVar23;
        local_a30 = pfVar22;
        for (local_a34 = 0; local_a34 < local_854; local_a34 = local_a34 + 1) {
          local_a38 = *(int *)(local_840 + (long)local_a34 * 4);
          local_a40 = (float *)(local_a10 + (long)local_a38 * 4);
          local_a48 = (float *)(local_a18 + (long)local_a38 * 4);
          local_a4c = *local_a20;
          local_a50 = local_a20[1];
          local_a54 = local_a20[2];
          local_a58 = local_a20[3];
          pfVar23[local_a34] =
               local_a40[-1] * local_a4c + *local_a40 * local_a50 + local_a40[1] * local_a54 +
               local_a40[2] * local_a58;
          pfVar22[local_a34] =
               local_a48[-1] * local_a4c + *local_a48 * local_a50 + local_a48[1] * local_a54 +
               local_a48[2] * local_a58;
          local_a20 = local_a20 + 4;
        }
      }
      else if (local_9b4 == local_9ac + 3) {
        local_a60 = local_990;
        local_a68 = local_998;
        local_a70 = local_9a0;
        local_990 = local_9a8;
        local_998 = pfVar23;
        local_9a0 = pfVar22;
        local_9a8 = pfVar21;
        local_778 = local_828;
        local_a78 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_9b4 * local_828[2];
        local_78c = local_9b4 + 1;
        local_788 = local_828;
        local_a80 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_78c * local_828[2];
        local_79c = local_9b4 + 2;
        local_798 = local_828;
        local_a88 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_79c * local_828[2];
        local_a90 = local_838;
        local_a98 = pfVar23;
        local_aa0 = pfVar22;
        local_aa8 = pfVar21;
        for (local_aac = 0; local_77c = local_9b4, local_aac < local_854; local_aac = local_aac + 1)
        {
          local_ab0 = *(int *)(local_840 + (long)local_aac * 4);
          local_ab8 = (float *)(local_a78 + (long)local_ab0 * 4);
          local_ac0 = (float *)(local_a80 + (long)local_ab0 * 4);
          local_ac8 = (float *)(local_a88 + (long)local_ab0 * 4);
          local_acc = *local_a90;
          local_ad0 = local_a90[1];
          local_ad4 = local_a90[2];
          local_ad8 = local_a90[3];
          pfVar23[local_aac] =
               local_ab8[-1] * local_acc + *local_ab8 * local_ad0 + local_ab8[1] * local_ad4 +
               local_ab8[2] * local_ad8;
          pfVar22[local_aac] =
               local_ac0[-1] * local_acc + *local_ac0 * local_ad0 + local_ac0[1] * local_ad4 +
               local_ac0[2] * local_ad8;
          pfVar21[local_aac] =
               local_ac8[-1] * local_acc + *local_ac8 * local_ad0 + local_ac8[1] * local_ad4 +
               local_ac8[2] * local_ad8;
          local_a90 = local_a90 + 4;
        }
      }
      else {
        local_7ac = local_9b4 + -1;
        local_7a8 = local_828;
        local_ae0 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_7ac * local_828[2];
        local_7b8 = local_828;
        local_ae8 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_9b4 * local_828[2];
        local_7cc = local_9b4 + 1;
        local_7c8 = local_828;
        local_af0 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_7cc * local_828[2];
        local_7dc = local_9b4 + 2;
        local_7d8 = local_828;
        local_af8 = *local_828 +
                    (long)*(int *)((long)local_828 + 0x2c) * (long)local_7dc * local_828[2];
        local_b00 = local_838;
        local_b08 = local_990;
        local_b10 = local_998;
        local_b18 = local_9a0;
        local_b20 = local_9a8;
        for (local_b24 = 0; local_7bc = local_9b4, local_b24 < local_854; local_b24 = local_b24 + 1)
        {
          local_b28 = *(int *)(local_840 + (long)local_b24 * 4);
          local_b30 = (float *)(local_ae0 + (long)local_b28 * 4);
          local_b38 = (float *)(local_ae8 + (long)local_b28 * 4);
          local_b40 = (float *)(local_af0 + (long)local_b28 * 4);
          local_b48 = (float *)(local_af8 + (long)local_b28 * 4);
          local_b4c = *local_b00;
          local_b50 = local_b00[1];
          local_b54 = local_b00[2];
          local_b58 = local_b00[3];
          local_990[local_b24] =
               local_b30[-1] * local_b4c + *local_b30 * local_b50 + local_b30[1] * local_b54 +
               local_b30[2] * local_b58;
          local_998[local_b24] =
               local_b38[-1] * local_b4c + *local_b38 * local_b50 + local_b38[1] * local_b54 +
               local_b38[2] * local_b58;
          local_9a0[local_b24] =
               local_b40[-1] * local_b4c + *local_b40 * local_b50 + local_b40[1] * local_b54 +
               local_b40[2] * local_b58;
          local_9a8[local_b24] =
               local_b48[-1] * local_b4c + *local_b48 * local_b50 + local_b48[1] * local_b54 +
               local_b48[2] * local_b58;
          local_b00 = local_b00 + 4;
        }
      }
    }
    local_b5c = *local_848;
    local_b60 = local_848[1];
    local_b64 = local_848[2];
    local_b68 = local_848[3];
    local_b70 = local_990;
    local_b78 = local_998;
    local_b80 = local_9a0;
    local_b88 = local_9a8;
    local_738 = local_830;
    local_73c = local_9b0;
    local_b90 = (float *)(*local_830 +
                         (long)*(int *)((long)local_830 + 0x2c) * (long)local_9b0 * local_830[2]);
    local_b94 = 0;
    auVar1 = vinsertps_avx(ZEXT416((uint)local_b5c),ZEXT416((uint)local_b5c),0x10);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_b5c),0x20);
    auVar1 = vinsertps_avx(auVar1,ZEXT416((uint)local_b5c),0x30);
    auVar2 = vinsertps_avx(ZEXT416((uint)local_b5c),ZEXT416((uint)local_b5c),0x10);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_b5c),0x20);
    auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_b5c),0x30);
    auVar25._16_16_ = auVar1;
    auVar25._0_16_ = auVar2;
    local_340._0_8_ = auVar2._0_8_;
    local_340._8_8_ = auVar2._8_8_;
    local_340._16_8_ = auVar1._0_8_;
    local_340._24_8_ = auVar1._8_8_;
    local_bc0 = local_340._0_8_;
    uStack_bb8 = local_340._8_8_;
    uStack_bb0 = local_340._16_8_;
    uStack_ba8 = local_340._24_8_;
    auVar3 = vinsertps_avx(ZEXT416((uint)local_b60),ZEXT416((uint)local_b60),0x10);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_b60),0x20);
    auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_b60),0x30);
    auVar4 = vinsertps_avx(ZEXT416((uint)local_b60),ZEXT416((uint)local_b60),0x10);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_b60),0x20);
    auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)local_b60),0x30);
    auVar26._16_16_ = auVar3;
    auVar26._0_16_ = auVar4;
    local_300._0_8_ = auVar4._0_8_;
    local_300._8_8_ = auVar4._8_8_;
    local_300._16_8_ = auVar3._0_8_;
    local_300._24_8_ = auVar3._8_8_;
    local_be0 = local_300._0_8_;
    uStack_bd8 = local_300._8_8_;
    uStack_bd0 = local_300._16_8_;
    uStack_bc8 = local_300._24_8_;
    auVar5 = vinsertps_avx(ZEXT416((uint)local_b64),ZEXT416((uint)local_b64),0x10);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)local_b64),0x20);
    auVar5 = vinsertps_avx(auVar5,ZEXT416((uint)local_b64),0x30);
    auVar6 = vinsertps_avx(ZEXT416((uint)local_b64),ZEXT416((uint)local_b64),0x10);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)local_b64),0x20);
    auVar6 = vinsertps_avx(auVar6,ZEXT416((uint)local_b64),0x30);
    auVar27._16_16_ = auVar5;
    auVar27._0_16_ = auVar6;
    local_2c0._0_8_ = auVar6._0_8_;
    local_2c0._8_8_ = auVar6._8_8_;
    local_2c0._16_8_ = auVar5._0_8_;
    local_2c0._24_8_ = auVar5._8_8_;
    local_c00 = local_2c0._0_8_;
    uStack_bf8 = local_2c0._8_8_;
    uStack_bf0 = local_2c0._16_8_;
    uStack_be8 = local_2c0._24_8_;
    auVar7 = vinsertps_avx(ZEXT416((uint)local_b68),ZEXT416((uint)local_b68),0x10);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_b68),0x20);
    auVar7 = vinsertps_avx(auVar7,ZEXT416((uint)local_b68),0x30);
    auVar8 = vinsertps_avx(ZEXT416((uint)local_b68),ZEXT416((uint)local_b68),0x10);
    auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)local_b68),0x20);
    auVar8 = vinsertps_avx(auVar8,ZEXT416((uint)local_b68),0x30);
    auVar28._16_16_ = auVar7;
    auVar28._0_16_ = auVar8;
    local_280._0_8_ = auVar8._0_8_;
    local_280._8_8_ = auVar8._8_8_;
    local_280._16_8_ = auVar7._0_8_;
    local_280._24_8_ = auVar7._8_8_;
    local_c20 = local_280._0_8_;
    uStack_c18 = local_280._8_8_;
    uStack_c10 = local_280._16_8_;
    uStack_c08 = local_280._24_8_;
    for (; local_b94 + 7 < local_854; local_b94 = local_b94 + 8) {
      local_58 = local_b70;
      local_c40 = *(undefined8 *)local_b70;
      uStack_c38 = *(undefined8 *)(local_b70 + 2);
      uStack_c30 = *(undefined8 *)(local_b70 + 4);
      uStack_c28 = *(undefined8 *)(local_b70 + 6);
      local_60 = local_b78;
      uVar9 = *(undefined8 *)local_b78;
      uVar10 = *(undefined8 *)(local_b78 + 2);
      uVar11 = *(undefined8 *)(local_b78 + 4);
      uVar12 = *(undefined8 *)(local_b78 + 6);
      local_68 = local_b80;
      uVar13 = *(undefined8 *)local_b80;
      uVar14 = *(undefined8 *)(local_b80 + 2);
      uVar15 = *(undefined8 *)(local_b80 + 4);
      uVar16 = *(undefined8 *)(local_b80 + 6);
      local_70 = local_b88;
      uVar17 = *(undefined8 *)local_b88;
      uVar18 = *(undefined8 *)(local_b88 + 2);
      uVar19 = *(undefined8 *)(local_b88 + 4);
      uVar20 = *(undefined8 *)(local_b88 + 6);
      local_700._0_4_ = (float)local_c40;
      local_700._4_4_ = (float)((ulong)local_c40 >> 0x20);
      uStack_6f8._0_4_ = (float)uStack_c38;
      uStack_6f8._4_4_ = (float)((ulong)uStack_c38 >> 0x20);
      uStack_6f0._0_4_ = (float)uStack_c30;
      uStack_6f0._4_4_ = (float)((ulong)uStack_c30 >> 0x20);
      uStack_6e8._0_4_ = (float)uStack_c28;
      uStack_6e8._4_4_ = (float)((ulong)uStack_c28 >> 0x20);
      local_720._0_4_ = auVar2._0_4_;
      local_720._4_4_ = auVar2._4_4_;
      uStack_718._0_4_ = auVar2._8_4_;
      uStack_718._4_4_ = auVar2._12_4_;
      uStack_710._0_4_ = auVar1._0_4_;
      uStack_710._4_4_ = auVar1._4_4_;
      uStack_708._0_4_ = auVar1._8_4_;
      local_cc0 = CONCAT44(local_700._4_4_ * local_720._4_4_,(float)local_700 * (float)local_720);
      uStack_cb8 = CONCAT44(uStack_6f8._4_4_ * uStack_718._4_4_,
                            (float)uStack_6f8 * (float)uStack_718);
      uStack_cb0 = CONCAT44(uStack_6f0._4_4_ * uStack_710._4_4_,
                            (float)uStack_6f0 * (float)uStack_710);
      uStack_ca8 = CONCAT44(uStack_6e8._4_4_,(float)uStack_6e8 * (float)uStack_708);
      local_608 = &local_c60;
      local_610 = &local_be0;
      local_618 = &local_cc0;
      local_c60._0_4_ = (float)uVar9;
      local_5e0 = (float)local_c60;
      local_c60._4_4_ = (float)((ulong)uVar9 >> 0x20);
      fStack_5dc = local_c60._4_4_;
      uStack_c58._0_4_ = (float)uVar10;
      fStack_5d8 = (float)uStack_c58;
      uStack_c58._4_4_ = (float)((ulong)uVar10 >> 0x20);
      fStack_5d4 = uStack_c58._4_4_;
      uStack_c50._0_4_ = (float)uVar11;
      fStack_5d0 = (float)uStack_c50;
      uStack_c50._4_4_ = (float)((ulong)uVar11 >> 0x20);
      fStack_5cc = uStack_c50._4_4_;
      uStack_c48._0_4_ = (float)uVar12;
      fStack_5c8 = (float)uStack_c48;
      uStack_c48._4_4_ = (float)((ulong)uVar12 >> 0x20);
      fStack_5c4 = uStack_c48._4_4_;
      local_600._0_4_ = auVar4._0_4_;
      local_600._4_4_ = auVar4._4_4_;
      uStack_5f8._0_4_ = auVar4._8_4_;
      uStack_5f8._4_4_ = auVar4._12_4_;
      uStack_5f0._0_4_ = auVar3._0_4_;
      uStack_5f0._4_4_ = auVar3._4_4_;
      uStack_5e8._0_4_ = auVar3._8_4_;
      local_220 = (float)local_c60 * (float)local_600;
      fStack_21c = local_c60._4_4_ * local_600._4_4_;
      fStack_218 = (float)uStack_c58 * (float)uStack_5f8;
      fStack_214 = uStack_c58._4_4_ * uStack_5f8._4_4_;
      fStack_210 = (float)uStack_c50 * (float)uStack_5f0;
      fStack_20c = uStack_c50._4_4_ * uStack_5f0._4_4_;
      fStack_208 = (float)uStack_c48 * (float)uStack_5e8;
      local_240 = local_cc0;
      uStack_238 = uStack_cb8;
      uStack_230 = uStack_cb0;
      uStack_228 = uStack_ca8;
      fVar24 = local_220 + (float)local_700 * (float)local_720;
      fVar29 = fStack_21c + local_700._4_4_ * local_720._4_4_;
      fVar30 = fStack_218 + (float)uStack_6f8 * (float)uStack_718;
      fVar31 = fStack_214 + uStack_6f8._4_4_ * uStack_718._4_4_;
      fVar32 = fStack_210 + (float)uStack_6f0 * (float)uStack_710;
      fVar33 = fStack_20c + uStack_6f0._4_4_ * uStack_710._4_4_;
      fVar34 = fStack_208 + (float)uStack_6e8 * (float)uStack_708;
      local_200 = CONCAT44(fVar29,fVar24);
      uStack_1f8 = CONCAT44(fVar31,fVar30);
      uStack_1f0 = CONCAT44(fVar33,fVar32);
      uStack_1e8 = CONCAT44(uStack_c48._4_4_ + uStack_6e8._4_4_,fVar34);
      local_668 = &local_c80;
      local_670 = &local_c00;
      local_678 = &local_cc0;
      local_c80._0_4_ = (float)uVar13;
      local_640 = (float)local_c80;
      local_c80._4_4_ = (float)((ulong)uVar13 >> 0x20);
      fStack_63c = local_c80._4_4_;
      uStack_c78._0_4_ = (float)uVar14;
      fStack_638 = (float)uStack_c78;
      uStack_c78._4_4_ = (float)((ulong)uVar14 >> 0x20);
      fStack_634 = uStack_c78._4_4_;
      uStack_c70._0_4_ = (float)uVar15;
      fStack_630 = (float)uStack_c70;
      uStack_c70._4_4_ = (float)((ulong)uVar15 >> 0x20);
      fStack_62c = uStack_c70._4_4_;
      uStack_c68._0_4_ = (float)uVar16;
      fStack_628 = (float)uStack_c68;
      uStack_c68._4_4_ = (float)((ulong)uVar16 >> 0x20);
      fStack_624 = uStack_c68._4_4_;
      local_660._0_4_ = auVar6._0_4_;
      local_660._4_4_ = auVar6._4_4_;
      uStack_658._0_4_ = auVar6._8_4_;
      uStack_658._4_4_ = auVar6._12_4_;
      uStack_650._0_4_ = auVar5._0_4_;
      uStack_650._4_4_ = auVar5._4_4_;
      uStack_648._0_4_ = auVar5._8_4_;
      local_1e0 = (float)local_c80 * (float)local_660;
      fStack_1dc = local_c80._4_4_ * local_660._4_4_;
      fStack_1d8 = (float)uStack_c78 * (float)uStack_658;
      fStack_1d4 = uStack_c78._4_4_ * uStack_658._4_4_;
      fStack_1d0 = (float)uStack_c70 * (float)uStack_650;
      fStack_1cc = uStack_c70._4_4_ * uStack_650._4_4_;
      fStack_1c8 = (float)uStack_c68 * (float)uStack_648;
      fVar24 = local_1e0 + fVar24;
      fVar29 = fStack_1dc + fVar29;
      fVar30 = fStack_1d8 + fVar30;
      fVar31 = fStack_1d4 + fVar31;
      fVar32 = fStack_1d0 + fVar32;
      fVar33 = fStack_1cc + fVar33;
      fVar34 = fStack_1c8 + fVar34;
      uStack_c68._4_4_ = uStack_c68._4_4_ + uStack_c48._4_4_ + uStack_6e8._4_4_;
      local_1c0 = CONCAT44(fVar29,fVar24);
      uStack_1b8 = CONCAT44(fVar31,fVar30);
      uStack_1b0 = CONCAT44(fVar33,fVar32);
      uStack_1a8 = CONCAT44(uStack_c68._4_4_,fVar34);
      local_6c8 = &local_ca0;
      local_6d0 = &local_c20;
      local_6d8 = &local_cc0;
      local_ca0._0_4_ = (float)uVar17;
      local_6a0 = (float)local_ca0;
      local_ca0._4_4_ = (float)((ulong)uVar17 >> 0x20);
      fStack_69c = local_ca0._4_4_;
      uStack_c98._0_4_ = (float)uVar18;
      fStack_698 = (float)uStack_c98;
      uStack_c98._4_4_ = (float)((ulong)uVar18 >> 0x20);
      fStack_694 = uStack_c98._4_4_;
      uStack_c90._0_4_ = (float)uVar19;
      fStack_690 = (float)uStack_c90;
      uStack_c90._4_4_ = (float)((ulong)uVar19 >> 0x20);
      fStack_68c = uStack_c90._4_4_;
      uStack_c88._0_4_ = (float)uVar20;
      fStack_688 = (float)uStack_c88;
      uStack_c88._4_4_ = (float)((ulong)uVar20 >> 0x20);
      fStack_684 = uStack_c88._4_4_;
      local_6c0._0_4_ = auVar8._0_4_;
      local_6c0._4_4_ = auVar8._4_4_;
      uStack_6b8._0_4_ = auVar8._8_4_;
      uStack_6b8._4_4_ = auVar8._12_4_;
      uStack_6b0._0_4_ = auVar7._0_4_;
      uStack_6b0._4_4_ = auVar7._4_4_;
      uStack_6a8._0_4_ = auVar7._8_4_;
      local_1a0 = (float)local_ca0 * (float)local_6c0;
      fStack_19c = local_ca0._4_4_ * local_6c0._4_4_;
      fStack_198 = (float)uStack_c98 * (float)uStack_6b8;
      fStack_194 = uStack_c98._4_4_ * uStack_6b8._4_4_;
      fStack_190 = (float)uStack_c90 * (float)uStack_6b0;
      fStack_18c = uStack_c90._4_4_ * uStack_6b0._4_4_;
      fStack_188 = (float)uStack_c88 * (float)uStack_6a8;
      local_cc0 = CONCAT44(fStack_19c + fVar29,local_1a0 + fVar24);
      uStack_cb8 = CONCAT44(fStack_194 + fVar31,fStack_198 + fVar30);
      uStack_cb0 = CONCAT44(fStack_18c + fVar33,fStack_190 + fVar32);
      uStack_ca8 = CONCAT44(uStack_c88._4_4_ + uStack_c68._4_4_,fStack_188 + fVar34);
      local_368 = local_b90;
      *(undefined8 *)local_b90 = local_cc0;
      *(undefined8 *)(local_b90 + 2) = uStack_cb8;
      *(undefined8 *)(local_b90 + 4) = uStack_cb0;
      *(undefined8 *)(local_b90 + 6) = uStack_ca8;
      local_b90 = local_b90 + 8;
      local_b70 = local_b70 + 8;
      local_b78 = local_b78 + 8;
      local_b80 = local_b80 + 8;
      local_b88 = local_b88 + 8;
      local_ca0 = uVar17;
      uStack_c98 = uVar18;
      uStack_c90 = uVar19;
      uStack_c88 = uVar20;
      local_c80 = uVar13;
      uStack_c78 = uVar14;
      uStack_c70 = uVar15;
      uStack_c68 = uVar16;
      local_c60 = uVar9;
      uStack_c58 = uVar10;
      uStack_c50 = uVar11;
      uStack_c48 = uVar12;
      local_720 = local_340._0_8_;
      uStack_718 = local_340._8_8_;
      uStack_710 = local_340._16_8_;
      uStack_708 = local_340._24_8_;
      local_700 = local_c40;
      uStack_6f8 = uStack_c38;
      uStack_6f0 = uStack_c30;
      uStack_6e8 = uStack_c28;
      local_6c0 = local_280._0_8_;
      uStack_6b8 = local_280._8_8_;
      uStack_6b0 = local_280._16_8_;
      uStack_6a8 = local_280._24_8_;
      local_660 = local_2c0._0_8_;
      uStack_658 = local_2c0._8_8_;
      uStack_650 = local_2c0._16_8_;
      uStack_648 = local_2c0._24_8_;
      local_600 = local_300._0_8_;
      uStack_5f8 = local_300._8_8_;
      uStack_5f0 = local_300._16_8_;
      uStack_5e8 = local_300._24_8_;
      local_3a0 = local_cc0;
      uStack_398 = uStack_cb8;
      uStack_390 = uStack_cb0;
      uStack_388 = uStack_ca8;
      fStack_204 = fStack_5c4;
      fStack_1c4 = fStack_624;
      fStack_184 = fStack_684;
    }
    local_cd0 = CONCAT44(local_b5c,local_b5c);
    uStack_cc8 = CONCAT44(local_b5c,local_b5c);
    local_ce0 = CONCAT44(local_b60,local_b60);
    uStack_cd8 = CONCAT44(local_b60,local_b60);
    local_cf0 = CONCAT44(local_b64,local_b64);
    uStack_ce8 = CONCAT44(local_b64,local_b64);
    local_d00 = CONCAT44(local_b68,local_b68);
    uStack_cf8 = CONCAT44(local_b68,local_b68);
    for (; local_b94 + 3 < local_854; local_b94 = local_b94 + 4) {
      local_38 = local_b70;
      local_d10 = *(undefined8 *)local_b70;
      uStack_d08 = *(undefined8 *)(local_b70 + 2);
      local_40 = local_b78;
      local_d20 = *(undefined8 *)local_b78;
      uStack_d18 = *(undefined8 *)(local_b78 + 2);
      local_48 = local_b80;
      local_d30 = *(undefined8 *)local_b80;
      uStack_d28 = *(undefined8 *)(local_b80 + 2);
      local_50 = local_b88;
      local_d40 = *(undefined8 *)local_b88;
      uStack_d38 = *(undefined8 *)(local_b88 + 2);
      local_530._0_4_ = (float)local_d10;
      local_530._4_4_ = (float)((ulong)local_d10 >> 0x20);
      uStack_528._0_4_ = (float)uStack_d08;
      uStack_528._4_4_ = (float)((ulong)uStack_d08 >> 0x20);
      local_d50 = CONCAT44(local_530._4_4_ * local_b5c,(float)local_530 * local_b5c);
      uStack_d48 = CONCAT44(uStack_528._4_4_ * local_b5c,(float)uStack_528 * local_b5c);
      local_488 = &local_d20;
      local_490 = &local_ce0;
      local_498 = &local_d50;
      local_470._0_4_ = (float)local_d20;
      local_470._4_4_ = (float)((ulong)local_d20 >> 0x20);
      uStack_468._0_4_ = (float)uStack_d18;
      uStack_468._4_4_ = (float)((ulong)uStack_d18 >> 0x20);
      local_160 = (float)local_470 * local_b60;
      fStack_15c = local_470._4_4_ * local_b60;
      fStack_158 = (float)uStack_468 * local_b60;
      fStack_154 = uStack_468._4_4_ * local_b60;
      local_170 = local_d50;
      uStack_168 = uStack_d48;
      fVar24 = local_160 + (float)local_530 * local_b5c;
      fVar29 = fStack_15c + local_530._4_4_ * local_b5c;
      fVar30 = fStack_158 + (float)uStack_528 * local_b5c;
      fVar31 = fStack_154 + uStack_528._4_4_ * local_b5c;
      local_150 = CONCAT44(fVar29,fVar24);
      uStack_148 = CONCAT44(fVar31,fVar30);
      local_4c8 = &local_d30;
      local_4d0 = &local_cf0;
      local_4d8 = &local_d50;
      local_4b0._0_4_ = (float)local_d30;
      local_4b0._4_4_ = (float)((ulong)local_d30 >> 0x20);
      uStack_4a8._0_4_ = (float)uStack_d28;
      uStack_4a8._4_4_ = (float)((ulong)uStack_d28 >> 0x20);
      local_140 = (float)local_4b0 * local_b64;
      fStack_13c = local_4b0._4_4_ * local_b64;
      fStack_138 = (float)uStack_4a8 * local_b64;
      fStack_134 = uStack_4a8._4_4_ * local_b64;
      fVar24 = local_140 + fVar24;
      fVar29 = fStack_13c + fVar29;
      fVar30 = fStack_138 + fVar30;
      fVar31 = fStack_134 + fVar31;
      local_130 = CONCAT44(fVar29,fVar24);
      uStack_128 = CONCAT44(fVar31,fVar30);
      local_508 = &local_d40;
      local_510 = &local_d00;
      local_518 = &local_d50;
      local_4f0._0_4_ = (float)local_d40;
      local_4f0._4_4_ = (float)((ulong)local_d40 >> 0x20);
      uStack_4e8._0_4_ = (float)uStack_d38;
      uStack_4e8._4_4_ = (float)((ulong)uStack_d38 >> 0x20);
      local_120 = (float)local_4f0 * local_b68;
      fStack_11c = local_4f0._4_4_ * local_b68;
      fStack_118 = (float)uStack_4e8 * local_b68;
      fStack_114 = uStack_4e8._4_4_ * local_b68;
      local_d50 = CONCAT44(fStack_11c + fVar29,local_120 + fVar24);
      uStack_d48 = CONCAT44(fStack_114 + fVar31,fStack_118 + fVar30);
      local_348 = local_b90;
      *(undefined8 *)local_b90 = local_d50;
      *(undefined8 *)(local_b90 + 2) = uStack_d48;
      local_b90 = local_b90 + 4;
      local_b70 = local_b70 + 4;
      local_b78 = local_b78 + 4;
      local_b80 = local_b80 + 4;
      local_b88 = local_b88 + 4;
      local_540 = local_cd0;
      uStack_538 = uStack_cc8;
      local_530 = local_d10;
      uStack_528 = uStack_d08;
      local_500 = local_d00;
      uStack_4f8 = uStack_cf8;
      local_4f0 = local_d40;
      uStack_4e8 = uStack_d38;
      local_4c0 = local_cf0;
      uStack_4b8 = uStack_ce8;
      local_4b0 = local_d30;
      uStack_4a8 = uStack_d28;
      local_480 = local_ce0;
      uStack_478 = uStack_cd8;
      local_470 = local_d20;
      uStack_468 = uStack_d18;
      local_360 = local_d50;
      uStack_358 = uStack_d48;
    }
    for (; local_b94 < local_854; local_b94 = local_b94 + 1) {
      *local_b90 = *local_b70 * local_b5c + *local_b78 * local_b60 + *local_b80 * local_b64 +
                   *local_b88 * local_b68;
      local_b90 = local_b90 + 1;
      local_b88 = local_b88 + 1;
      local_b80 = local_b80 + 1;
      local_b78 = local_b78 + 1;
      local_b70 = local_b70 + 1;
    }
    local_848 = local_848 + 4;
    local_9ac = local_9b4;
    local_730 = local_b68;
    local_72c = local_b64;
    local_728 = local_b60;
    local_724 = local_b5c;
    local_5c0 = local_b68;
    fStack_5bc = local_b68;
    fStack_5b8 = local_b68;
    fStack_5b4 = local_b68;
    local_5a4 = local_b68;
    local_5a0 = local_b64;
    fStack_59c = local_b64;
    fStack_598 = local_b64;
    fStack_594 = local_b64;
    local_584 = local_b64;
    local_580 = local_b60;
    fStack_57c = local_b60;
    fStack_578 = local_b60;
    fStack_574 = local_b60;
    local_564 = local_b60;
    local_560 = local_b5c;
    fStack_55c = local_b5c;
    fStack_558 = local_b5c;
    fStack_554 = local_b5c;
    local_544 = local_b5c;
    local_340 = auVar25;
    local_320 = local_b5c;
    local_31c = local_b5c;
    local_318 = local_b5c;
    local_314 = local_b5c;
    local_310 = local_b5c;
    local_30c = local_b5c;
    local_308 = local_b5c;
    local_304 = local_b5c;
    local_300 = auVar26;
    local_2e0 = local_b60;
    local_2dc = local_b60;
    local_2d8 = local_b60;
    local_2d4 = local_b60;
    local_2d0 = local_b60;
    local_2cc = local_b60;
    local_2c8 = local_b60;
    local_2c4 = local_b60;
    local_2c0 = auVar27;
    local_2a0 = local_b64;
    local_29c = local_b64;
    local_298 = local_b64;
    local_294 = local_b64;
    local_290 = local_b64;
    local_28c = local_b64;
    local_288 = local_b64;
    local_284 = local_b64;
    local_280 = auVar28;
    local_260 = local_b68;
    local_25c = local_b68;
    local_258 = local_b68;
    local_254 = local_b68;
    local_250 = local_b68;
    local_24c = local_b68;
    local_248 = local_b68;
    local_244 = local_b68;
  }
  local_820 = &local_988;
  local_3e8 = local_820;
  if (local_980 != (int *)0x0) {
    local_3ec = 0xffffffff;
    LOCK();
    local_3f0 = *local_980;
    *local_980 = *local_980 + -1;
    UNLOCK();
    if (local_3f0 == 1) {
      if (local_968 == (long *)0x0) {
        local_3e0 = local_988;
        if (local_988 != (float *)0x0) {
          free(local_988);
        }
      }
      else {
        (**(code **)(*local_968 + 0x18))(local_968,local_988);
      }
    }
  }
  local_988 = (float *)0x0;
  local_978 = 0;
  local_970 = 0;
  local_960 = 0;
  local_95c = 0;
  local_958 = 0;
  local_954 = 0;
  local_950 = 0;
  local_948 = 0;
  local_980 = (int *)0x0;
  local_810 = &local_940;
  local_408 = local_810;
  if (local_938 != (int *)0x0) {
    local_40c = 0xffffffff;
    LOCK();
    local_410 = *local_938;
    *local_938 = *local_938 + -1;
    UNLOCK();
    if (local_410 == 1) {
      if (local_920 == (long *)0x0) {
        local_3d0 = local_940;
        if (local_940 != (float *)0x0) {
          free(local_940);
        }
      }
      else {
        (**(code **)(*local_920 + 0x18))(local_920,local_940);
      }
    }
  }
  local_940 = (float *)0x0;
  local_930 = 0;
  local_928 = 0;
  local_918 = 0;
  local_914 = 0;
  local_910 = 0;
  local_90c = 0;
  local_908 = 0;
  local_900 = 0;
  local_938 = (int *)0x0;
  local_800 = &local_8e8;
  local_428 = local_800;
  if (local_8e0 != (int *)0x0) {
    local_42c = 0xffffffff;
    LOCK();
    local_430 = *local_8e0;
    *local_8e0 = *local_8e0 + -1;
    UNLOCK();
    if (local_430 == 1) {
      if (local_8c8 == (long *)0x0) {
        local_3c0 = local_8e8;
        if (local_8e8 != (float *)0x0) {
          free(local_8e8);
        }
      }
      else {
        (**(code **)(*local_8c8 + 0x18))(local_8c8,local_8e8);
      }
    }
  }
  local_8e8 = (float *)0x0;
  local_8d8 = 0;
  local_8d0 = 0;
  local_8c0 = 0;
  local_8bc = 0;
  local_8b8 = 0;
  local_8b4 = 0;
  local_8b0 = 0;
  local_8a8 = 0;
  local_8e0 = (int *)0x0;
  local_7f0 = &local_8a0;
  if (local_898 != (int *)0x0) {
    local_44c = 0xffffffff;
    LOCK();
    local_450 = *local_898;
    *local_898 = *local_898 + -1;
    UNLOCK();
    if (local_450 == 1) {
      local_448 = local_7f0;
      if (local_880 == (long *)0x0) {
        local_3b0 = local_8a0;
        if (local_8a0 != (float *)0x0) {
          free(local_8a0);
        }
      }
      else {
        (**(code **)(*local_880 + 0x18))(local_880,local_8a0);
      }
    }
  }
  return;
}

Assistant:

static void resize_bicubic_image(const Mat& src, Mat& dst, float* alpha, int* xofs, float* beta, int* yofs)
{
    int w = dst.w;
    int h = dst.h;

    // loop body
    Mat rowsbuf0(w);
    Mat rowsbuf1(w);
    Mat rowsbuf2(w);
    Mat rowsbuf3(w);
    float* rows0 = rowsbuf0;
    float* rows1 = rowsbuf1;
    float* rows2 = rowsbuf2;
    float* rows3 = rowsbuf3;

    int prev_sy1 = -3;

    for (int dy = 0; dy < h; dy++)
    {
        int sy = yofs[dy];

        if (sy == prev_sy1)
        {
            // reuse all rows
        }
        else if (sy == prev_sy1 + 1)
        {
            // hresize one row
            float* rows0_old = rows0;
            rows0 = rows1;
            rows1 = rows2;
            rows2 = rows3;
            rows3 = rows0_old;
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 2)
        {
            // hresize two rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            rows0 = rows2;
            rows1 = rows3;
            rows2 = rows0_old;
            rows3 = rows1_old;
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else if (sy == prev_sy1 + 3)
        {
            // hresize three rows
            float* rows0_old = rows0;
            float* rows1_old = rows1;
            float* rows2_old = rows2;
            rows0 = rows3;
            rows1 = rows0_old;
            rows2 = rows1_old;
            rows3 = rows2_old;
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows1p[dx] = S1p[-1] * a0 + S1p[0] * a1 + S1p[1] * a2 + S1p[2] * a3;
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }
        else
        {
            // hresize four rows
            const float* S0 = src.row(sy - 1);
            const float* S1 = src.row(sy);
            const float* S2 = src.row(sy + 1);
            const float* S3 = src.row(sy + 2);

            const float* alphap = alpha;
            float* rows0p = rows0;
            float* rows1p = rows1;
            float* rows2p = rows2;
            float* rows3p = rows3;
            for (int dx = 0; dx < w; dx++)
            {
                int sx = xofs[dx];
                const float* S0p = S0 + sx;
                const float* S1p = S1 + sx;
                const float* S2p = S2 + sx;
                const float* S3p = S3 + sx;

                float a0 = alphap[0];
                float a1 = alphap[1];
                float a2 = alphap[2];
                float a3 = alphap[3];
                rows0p[dx] = S0p[-1] * a0 + S0p[0] * a1 + S0p[1] * a2 + S0p[2] * a3;
                rows1p[dx] = S1p[-1] * a0 + S1p[0] * a1 + S1p[1] * a2 + S1p[2] * a3;
                rows2p[dx] = S2p[-1] * a0 + S2p[0] * a1 + S2p[1] * a2 + S2p[2] * a3;
                rows3p[dx] = S3p[-1] * a0 + S3p[0] * a1 + S3p[1] * a2 + S3p[2] * a3;

                alphap += 4;
            }
        }

        prev_sy1 = sy;

        // vresize
        float b0 = beta[0];
        float b1 = beta[1];
        float b2 = beta[2];
        float b3 = beta[3];

        float* rows0p = rows0;
        float* rows1p = rows1;
        float* rows2p = rows2;
        float* rows3p = rows3;
        float* Dp = dst.row(dy);

        int dx = 0;
#if __SSE2__
#if __AVX__
        __m256 _b0_256 = _mm256_set1_ps(b0);
        __m256 _b1_256 = _mm256_set1_ps(b1);
        __m256 _b2_256 = _mm256_set1_ps(b2);
        __m256 _b3_256 = _mm256_set1_ps(b3);
        for (; dx + 7 < w; dx += 8)
        {
            __m256 _rows0 = _mm256_loadu_ps(rows0p);
            __m256 _rows1 = _mm256_loadu_ps(rows1p);
            __m256 _rows2 = _mm256_loadu_ps(rows2p);
            __m256 _rows3 = _mm256_loadu_ps(rows3p);
            __m256 _Dp = _mm256_mul_ps(_rows0, _b0_256);
            _Dp = _mm256_comp_fmadd_ps(_rows1, _b1_256, _Dp);
            _Dp = _mm256_comp_fmadd_ps(_rows2, _b2_256, _Dp);
            _Dp = _mm256_comp_fmadd_ps(_rows3, _b3_256, _Dp);
            _mm256_storeu_ps(Dp, _Dp);

            Dp += 8;
            rows0p += 8;
            rows1p += 8;
            rows2p += 8;
            rows3p += 8;
        }
#endif // __AVX__
        __m128 _b0_128 = _mm_set1_ps(b0);
        __m128 _b1_128 = _mm_set1_ps(b1);
        __m128 _b2_128 = _mm_set1_ps(b2);
        __m128 _b3_128 = _mm_set1_ps(b3);
        for (; dx + 3 < w; dx += 4)
        {
            __m128 _rows0 = _mm_loadu_ps(rows0p);
            __m128 _rows1 = _mm_loadu_ps(rows1p);
            __m128 _rows2 = _mm_loadu_ps(rows2p);
            __m128 _rows3 = _mm_loadu_ps(rows3p);
            __m128 _Dp = _mm_mul_ps(_rows0, _b0_128);
            _Dp = _mm_comp_fmadd_ps(_rows1, _b1_128, _Dp);
            _Dp = _mm_comp_fmadd_ps(_rows2, _b2_128, _Dp);
            _Dp = _mm_comp_fmadd_ps(_rows3, _b3_128, _Dp);
            _mm_storeu_ps(Dp, _Dp);

            Dp += 4;
            rows0p += 4;
            rows1p += 4;
            rows2p += 4;
            rows3p += 4;
        }
#endif // __SSE2__
        for (; dx < w; dx++)
        {
            *Dp++ = *rows0p++ * b0 + *rows1p++ * b1 + *rows2p++ * b2 + *rows3p++ * b3;
        }

        beta += 4;
    }
}